

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

bool __thiscall
soplex::SPxLPBase<double>::readMPS
          (SPxLPBase<double> *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars)

{
  LPColSetBase<double> *this_00;
  char cVar1;
  Verbosity VVar2;
  char *pcVar3;
  NameSet *pNVar4;
  NameSet *this_01;
  bool bVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  SPxOut *pSVar11;
  double *pdVar12;
  pointer pdVar13;
  ulong *puVar14;
  SPxOut *pSVar15;
  int *piVar16;
  double dVar17;
  _func_int *p_Var18;
  NameSet *local_618;
  double val;
  SPxOut *local_608;
  NameSet *local_5f0;
  SPxOut *local_5e8;
  DIdxSet *local_5e0;
  Verbosity old_verbosity_1;
  SVectorBase<double> local_5d0;
  LPColSetBase<double> *local_5b8;
  NameSet *local_5b0;
  NameSet *local_5a8;
  SPxOut *local_5a0;
  MPSInput local_598;
  Verbosity old_verbosity;
  undefined4 uStack_234;
  double local_230;
  int *piStack_228;
  DSVectorBase<double> local_220 [7];
  char colname [256];
  
  local_5e0 = p_intvars;
  local_5b0 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_618 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_618,1);
    p_cnames = local_618;
    NameSet::NameSet(local_618,10000,-1,2.0,2.0);
  }
  local_618 = p_cnames;
  NameSet::clear(p_cnames);
  local_5a8 = p_rnames;
  if (p_rnames == (NameSet *)0x0) {
    local_5f0 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_5f0,1);
    p_rnames = local_5f0;
    NameSet::NameSet(local_5f0,10000,-1,2.0,2.0);
  }
  this_00 = &this->super_LPColSetBase<double>;
  local_5f0 = p_rnames;
  NameSet::clear(p_rnames);
  clear(this);
  SVSetBase<double>::memRemax(&this_00->super_SVSetBase<double>,100000);
  local_5b8 = this_00;
  LPColSetBase<double>::reMax(this_00,10000);
  local_598._vptr_MPSInput = (_func_int **)&PTR__MPSInput_0053cf70;
  local_598.m_section = NAME;
  local_598.m_lineno = 0;
  local_598.m_objsense = MINIMIZE;
  local_598.m_has_error = false;
  local_598.m_buf[0] = '\0';
  local_598.m_is_integer = false;
  local_598.m_is_new_format = false;
  local_598.m_ignored = 0;
  local_598.m_objname[0] = '\0';
  local_598.m_f0 = (char *)0x0;
  local_598.m_f1 = (char *)0x0;
  local_598.m_f2 = (char *)0x0;
  local_598.m_f3 = (char *)0x0;
  local_598.m_f4 = (char *)0x0;
  local_598.m_f5 = (char *)0x0;
  local_598.m_probname[0] = '\0';
  local_598.m_input = p_input;
  MPSreadName(&local_598,this->spxout);
  if (local_598.m_section == OBJSEN) {
    MPSreadObjsen(&local_598);
  }
  if (local_598.m_section == OBJNAME) {
    MPSreadObjname(&local_598);
  }
  pNVar4 = local_5f0;
  if (local_598.m_section == ROWS) {
    pSVar15 = this->spxout;
    LPRowBase<double>::LPRowBase((LPRowBase<double> *)colname,0);
    while (bVar5 = MPSInput::readLine(&local_598), bVar5) {
      if (local_598.m_f0 != (char *)0x0) {
        if ((pSVar15 != (SPxOut *)0x0) && (3 < (int)pSVar15->m_verbosity)) {
          _old_verbosity = (_func_int **)CONCAT44(uStack_234,pSVar15->m_verbosity);
          old_verbosity_1 = INFO2;
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
          pSVar11 = soplex::operator<<(pSVar15,"IMPSRD02 Objective name : ");
          pSVar11 = soplex::operator<<(pSVar11,local_598.m_objname);
          std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity);
        }
        iVar6 = strcmp(local_598.m_f0,"COLUMNS");
        if (iVar6 == 0) {
          local_598.m_section = COLUMNS;
          goto LAB_001812ae;
        }
        break;
      }
      if ((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) break;
      if (*local_598.m_f1 == 'N') {
        if (local_598.m_objname[0] == '\0') {
          MPSInput::setObjName(&local_598,local_598.m_f2);
        }
      }
      else {
        bVar5 = NameSet::has(pNVar4,local_598.m_f2);
        if (bVar5) break;
        NameSet::add(pNVar4,local_598.m_f2);
        cVar1 = *local_598.m_f1;
        if (cVar1 == 'E') {
          colname[0] = '\0';
          colname[1] = '\0';
          colname[2] = '\0';
          colname[3] = '\0';
          colname[4] = '\0';
          colname[5] = '\0';
          colname[6] = '\0';
          colname[7] = '\0';
          colname[8] = '\0';
          colname[9] = '\0';
          colname[10] = '\0';
          colname[0xb] = '\0';
          colname[0xc] = '\0';
          colname[0xd] = '\0';
          colname[0xe] = '\0';
          colname[0xf] = '\0';
        }
        else if (cVar1 == 'L') {
          puVar14 = (ulong *)infinity();
          colname._0_8_ = *puVar14 ^ 0x8000000000000000;
          colname[8] = '\0';
          colname[9] = '\0';
          colname[10] = '\0';
          colname[0xb] = '\0';
          colname[0xc] = '\0';
          colname[0xd] = '\0';
          colname[0xe] = '\0';
          colname[0xf] = '\0';
        }
        else {
          if (cVar1 != 'G') break;
          colname[0] = '\0';
          colname[1] = '\0';
          colname[2] = '\0';
          colname[3] = '\0';
          colname[4] = '\0';
          colname[5] = '\0';
          colname[6] = '\0';
          colname[7] = '\0';
          pcVar8 = (char *)infinity();
          colname._8_8_ = *(undefined8 *)pcVar8;
        }
        LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,(LPRowBase<double> *)colname);
      }
    }
    MPSInput::syntaxError(&local_598);
LAB_001812ae:
    DSVectorBase<double>::~DSVectorBase((DSVectorBase<double> *)(colname + 0x18));
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])(this);
  this_01 = local_5f0;
  pNVar4 = local_618;
  if (local_598.m_section == COLUMNS) {
    memset(colname,0,0x100);
    LPColBase<double>::LPColBase
              ((LPColBase<double> *)&old_verbosity,
               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    DSVectorBase<double>::DSVectorBase((DSVectorBase<double> *)&old_verbosity_1,8);
    piStack_228 = (int *)0x0;
    local_5d0.memused = 0;
    piVar16 = piStack_228;
    while (piStack_228 = piVar16, bVar5 = MPSInput::readLine(&local_598), pcVar8 = local_598.m_f1,
          bVar5) {
      if (local_598.m_f0 != (char *)0x0) {
        iVar6 = strcmp(local_598.m_f0,"RHS");
        if (iVar6 == 0) {
          if (colname[0] != '\0') {
            DSVectorBase<double>::operator=(local_220,&local_5d0);
            LPColSetBase<double>::add(local_5b8,(LPColBase<double> *)&old_verbosity);
          }
          local_598.m_section = RHS;
          goto LAB_0018163c;
        }
        break;
      }
      if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
         (local_598.m_f3 == (char *)0x0)) break;
      iVar6 = strcmp(colname,local_598.m_f1);
      if (iVar6 != 0) {
        if (colname[0] != '\0') {
          DSVectorBase<double>::operator=(local_220,&local_5d0);
          LPColSetBase<double>::add(local_5b8,(LPColBase<double> *)&old_verbosity);
          pcVar8 = local_598.m_f1;
        }
        spxSnprintf(colname,0xff,"%s",pcVar8);
        colname[0xff] = '\0';
        iVar6 = (pNVar4->set).thesize;
        NameSet::add(pNVar4,colname);
        if ((pNVar4->set).thesize <= iVar6) {
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "ERROR in COLUMNS: duplicate column name or not column-wise ordering"
                                   );
          std::endl<char,std::char_traits<char>>(poVar10);
          break;
        }
        local_5d0.memused = 0;
        local_230 = 0.0;
        piStack_228 = (int *)0x0;
        puVar9 = (undefined8 *)infinity();
        _old_verbosity = (_func_int **)*puVar9;
        if (local_598.m_is_integer == true) {
          if (local_5e0 != (DIdxSet *)0x0) {
            iVar6 = NameSet::number(pNVar4,colname);
            DIdxSet::addIdx(local_5e0,iVar6);
          }
          _old_verbosity = (_func_int **)&DAT_3ff0000000000000;
        }
      }
      piVar16 = (int *)atof(local_598.m_f3);
      pcVar8 = local_598.m_f2;
      val = (double)piVar16;
      iVar6 = strcmp(local_598.m_f2,local_598.m_objname);
      if (iVar6 != 0) {
        iVar6 = NameSet::number(this_01,pcVar8);
        if (iVar6 < 0) {
          MPSInput::entryIgnored(&local_598,"Column",local_598.m_f1,"row",local_598.m_f2);
          piVar16 = piStack_228;
        }
        else if ((val != 0.0) || (piVar16 = piStack_228, NAN(val))) {
          DSVectorBase<double>::add((DSVectorBase<double> *)&old_verbosity_1,iVar6,&val);
          piVar16 = piStack_228;
        }
      }
      piStack_228 = piVar16;
      piVar16 = piStack_228;
      if (local_598.m_f5 != (char *)0x0) {
        piVar16 = (int *)atof(local_598.m_f5);
        pcVar8 = local_598.m_f4;
        val = (double)piVar16;
        iVar6 = strcmp(local_598.m_f4,local_598.m_objname);
        if (iVar6 != 0) {
          iVar6 = NameSet::number(this_01,pcVar8);
          if (iVar6 < 0) {
            MPSInput::entryIgnored(&local_598,"Column",local_598.m_f1,"row",local_598.m_f4);
            piVar16 = piStack_228;
          }
          else if ((val != 0.0) || (piVar16 = piStack_228, NAN(val))) {
            DSVectorBase<double>::add((DSVectorBase<double> *)&old_verbosity_1,iVar6,&val);
            piVar16 = piStack_228;
          }
        }
      }
    }
    MPSInput::syntaxError(&local_598);
LAB_0018163c:
    DSVectorBase<double>::~DSVectorBase((DSVectorBase<double> *)&old_verbosity_1);
    DSVectorBase<double>::~DSVectorBase(local_220);
  }
  pNVar4 = local_5f0;
  if (local_598.m_section == RHS) {
    pSVar15 = this->spxout;
    memset(colname,0,0x100);
    memset(&old_verbosity,0,0x100);
    while (bVar5 = MPSInput::readLine(&local_598), bVar5) {
      if (local_598.m_f0 != (char *)0x0) {
        if ((pSVar15 != (SPxOut *)0x0) && (3 < (int)pSVar15->m_verbosity)) {
          val = (double)CONCAT44(val._4_4_,4);
          old_verbosity_1 = pSVar15->m_verbosity;
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
          pSVar11 = soplex::operator<<(pSVar15,"IMPSRD03 RHS name       : ");
          pSVar11 = soplex::operator<<(pSVar11,colname);
          std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity_1);
        }
        pcVar8 = local_598.m_f0;
        iVar6 = strcmp(local_598.m_f0,"RANGES");
        if (iVar6 == 0) {
          local_598.m_section = RANGES;
          goto LAB_00181ac6;
        }
        iVar6 = strcmp(pcVar8,"BOUNDS");
        if (iVar6 == 0) {
          local_598.m_section = BOUNDS;
          goto LAB_00181ac6;
        }
        iVar6 = strcmp(pcVar8,"ENDATA");
        if (iVar6 == 0) {
          local_598.m_section = ENDATA;
          goto LAB_00181ac6;
        }
        break;
      }
      if ((local_598.m_f2 != (char *)0x0 && local_598.m_f3 == (char *)0x0) ||
         ((local_598.m_f4 != (char *)0x0 && (local_598.m_f5 == (char *)0x0)))) {
        MPSInput::insertName(&local_598,"_RHS_",false);
      }
      if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
         (local_598.m_f3 == (char *)0x0)) break;
      if (colname[0] == '\0') {
        spxSnprintf(colname,0x100,"%s",local_598.m_f1);
      }
      pcVar8 = local_598.m_f1;
      iVar6 = strcmp(colname,local_598.m_f1);
      if (iVar6 == 0) {
        uVar7 = NameSet::number(pNVar4,local_598.m_f2);
        if ((int)uVar7 < 0) {
          MPSInput::entryIgnored(&local_598,"RHS",local_598.m_f1,"row",local_598.m_f2);
        }
        else {
          local_608 = (SPxOut *)atof(local_598.m_f3);
          dVar17 = (this->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
          pdVar12 = (double *)infinity();
          if (dVar17 < *pdVar12) {
            (this->super_LPRowSetBase<double>).right.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar7] = (double)local_608;
          }
          dVar17 = (this->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
          pdVar12 = (double *)infinity();
          if (-*pdVar12 < dVar17) {
            (this->super_LPRowSetBase<double>).left.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar7] = (double)local_608;
          }
        }
        if (local_598.m_f5 != (char *)0x0) {
          uVar7 = NameSet::number(pNVar4,local_598.m_f4);
          if ((int)uVar7 < 0) {
            MPSInput::entryIgnored(&local_598,"RHS",local_598.m_f1,"row",local_598.m_f4);
          }
          else {
            local_608 = (SPxOut *)atof(local_598.m_f5);
            dVar17 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
            pdVar12 = (double *)infinity();
            if (dVar17 < *pdVar12) {
              (this->super_LPRowSetBase<double>).right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar7] = (double)local_608;
            }
            dVar17 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
            pdVar12 = (double *)infinity();
            if (-*pdVar12 < dVar17) {
              (this->super_LPRowSetBase<double>).left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar7] = (double)local_608;
            }
          }
        }
      }
      else {
        iVar6 = strcmp((char *)&old_verbosity,pcVar8);
        if (((iVar6 != 0) &&
            (spxSnprintf((char *)&old_verbosity,0x100,"%s",pcVar8), pSVar15 != (SPxOut *)0x0)) &&
           (4 < (int)pSVar15->m_verbosity)) {
          val = (double)CONCAT44(val._4_4_,5);
          old_verbosity_1 = pSVar15->m_verbosity;
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&val);
          pSVar11 = soplex::operator<<(pSVar15,"IMPSRD07 RHS ignored    : ");
          pSVar11 = soplex::operator<<(pSVar11,(char *)&old_verbosity);
          std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
        }
      }
    }
    MPSInput::syntaxError(&local_598);
  }
LAB_00181ac6:
  pNVar4 = local_5f0;
  if (local_598.m_section == RANGES) {
    local_5e8 = this->spxout;
    memset(colname,0,0x100);
    while (bVar5 = MPSInput::readLine(&local_598), pSVar15 = local_5e8, bVar5) {
      if (local_598.m_f0 != (char *)0x0) {
        if ((local_5e8 != (SPxOut *)0x0) && (3 < (int)local_5e8->m_verbosity)) {
          _old_verbosity = (_func_int **)CONCAT44(uStack_234,local_5e8->m_verbosity);
          old_verbosity_1 = INFO2;
          (*local_5e8->_vptr_SPxOut[2])(local_5e8);
          pSVar11 = soplex::operator<<(pSVar15,"IMPSRD04 Range name     : ");
          pSVar11 = soplex::operator<<(pSVar11,colname);
          std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity);
        }
        pcVar8 = local_598.m_f0;
        iVar6 = strcmp(local_598.m_f0,"BOUNDS");
        if (iVar6 == 0) {
          local_598.m_section = BOUNDS;
          goto LAB_00181f26;
        }
        iVar6 = strcmp(pcVar8,"ENDATA");
        if (iVar6 == 0) {
          local_598.m_section = ENDATA;
          goto LAB_00181f26;
        }
        break;
      }
      if ((local_598.m_f2 != (char *)0x0 && local_598.m_f3 == (char *)0x0) ||
         ((local_598.m_f4 != (char *)0x0 && (local_598.m_f5 == (char *)0x0)))) {
        MPSInput::insertName(&local_598,"_RNG_",false);
      }
      if (((local_598.m_f1 == (char *)0x0) || (local_598.m_f2 == (char *)0x0)) ||
         (local_598.m_f3 == (char *)0x0)) break;
      if (colname[0] == '\0') {
        spxSnprintf(colname,0x100,"%s");
      }
      iVar6 = strcmp(colname,local_598.m_f1);
      if (iVar6 == 0) {
        uVar7 = NameSet::number(pNVar4,local_598.m_f2);
        if ((int)uVar7 < 0) {
          MPSInput::entryIgnored(&local_598,"Range",local_598.m_f1,"row",local_598.m_f2);
        }
        else {
          local_608 = (SPxOut *)atof(local_598.m_f3);
          dVar17 = (this->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
          pdVar12 = (double *)infinity();
          if ((dVar17 <= -*pdVar12) ||
             (dVar17 = (this->super_LPRowSetBase<double>).right.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7], pdVar12 = (double *)infinity(),
             *pdVar12 <= dVar17)) {
            dVar17 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
            pdVar12 = (double *)infinity();
            if (-*pdVar12 < dVar17) {
              (this->super_LPRowSetBase<double>).right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar7] =
                   ABS((double)local_608) +
                   (this->super_LPRowSetBase<double>).left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
              goto LAB_00181d13;
            }
            pdVar13 = (this->super_LPRowSetBase<double>).left.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar17 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7] - ABS((double)local_608);
          }
          else {
            if (0.0 <= (double)local_608) {
              pdVar13 = (this->super_LPRowSetBase<double>).right.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            else {
              pdVar13 = (this->super_LPRowSetBase<double>).left.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            dVar17 = pdVar13[uVar7] + (double)local_608;
          }
          pdVar13[uVar7] = dVar17;
        }
LAB_00181d13:
        if (local_598.m_f5 != (char *)0x0) {
          uVar7 = NameSet::number(pNVar4,local_598.m_f4);
          if ((int)uVar7 < 0) {
            MPSInput::entryIgnored(&local_598,"Range",local_598.m_f1,"row",local_598.m_f4);
          }
          else {
            local_608 = (SPxOut *)atof(local_598.m_f5);
            dVar17 = (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
            pdVar12 = (double *)infinity();
            if ((dVar17 <= -*pdVar12) ||
               (dVar17 = (this->super_LPRowSetBase<double>).right.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7], pdVar12 = (double *)infinity(),
               *pdVar12 <= dVar17)) {
              dVar17 = (this->super_LPRowSetBase<double>).left.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7];
              pdVar12 = (double *)infinity();
              if (dVar17 <= -*pdVar12) {
                (this->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar7] =
                     (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7] - ABS((double)local_608);
              }
              else {
                (this->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar7] =
                     ABS((double)local_608) +
                     (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
              }
            }
            else {
              if (0.0 <= (double)local_608) {
                pdVar13 = (this->super_LPRowSetBase<double>).right.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              else {
                pdVar13 = (this->super_LPRowSetBase<double>).left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              pdVar13[uVar7] = pdVar13[uVar7] + (double)local_608;
            }
          }
        }
      }
    }
    MPSInput::syntaxError(&local_598);
  }
LAB_00181f26:
  pNVar4 = local_618;
  if (local_598.m_section == BOUNDS) {
    local_5a0 = this->spxout;
    DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,8);
    memset(colname,0,0x100);
    local_608 = (SPxOut *)&(this->super_LPColSetBase<double>).up;
    local_5e8 = (SPxOut *)&(this->super_LPColSetBase<double>).low;
LAB_00181f8a:
    bVar5 = MPSInput::readLine(&local_598);
    pSVar15 = local_5a0;
    if (bVar5) {
      if (local_598.m_f0 != (char *)0x0) {
        if ((local_5a0 != (SPxOut *)0x0) && (3 < (int)local_5a0->m_verbosity)) {
          val = (double)CONCAT44(val._4_4_,4);
          old_verbosity_1 = local_5a0->m_verbosity;
          (*local_5a0->_vptr_SPxOut[2])(local_5a0);
          pSVar11 = soplex::operator<<(pSVar15,"IMPSRD05 Bound name     : ");
          pSVar11 = soplex::operator<<(pSVar11,colname);
          std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity_1);
        }
        iVar6 = strcmp(local_598.m_f0,"ENDATA");
        if (iVar6 == 0) {
          local_598.m_section = ENDATA;
          goto LAB_001823aa;
        }
        goto switchD_00182231_caseD_4e;
      }
      cVar1 = *local_598.m_f1;
      pcVar8 = local_598.m_f3;
      pcVar3 = local_598.m_f2;
      if (cVar1 == 'F') {
        if (local_598.m_f1[1] == 'X') goto LAB_00181feb;
      }
      else if (cVar1 == 'U') {
        if ((local_598.m_f1[1] == 'I') || (local_598.m_f1[1] == 'P')) goto LAB_00181feb;
      }
      else if ((cVar1 == 'L') && ((local_598.m_f1[1] == 'I' || (local_598.m_f1[1] == 'O')))) {
LAB_00181feb:
        if (local_598.m_f1[2] == '\0') {
          pcVar8 = local_598.m_f4;
          pcVar3 = local_598.m_f3;
        }
      }
      if ((((pcVar3 != (char *)0x0) && (pcVar8 == (char *)0x0)) &&
          (MPSInput::insertName(&local_598,"_BND_",true), local_598.m_f1 == (char *)0x0)) ||
         ((local_598.m_f2 == (char *)0x0 || (local_598.m_f3 == (char *)0x0))))
      goto switchD_00182231_caseD_4e;
      if (colname[0] == '\0') {
        spxSnprintf(colname,0x100,"%s");
      }
      iVar6 = strcmp(colname,local_598.m_f2);
      if (iVar6 == 0) {
        uVar7 = NameSet::number(pNVar4,local_598.m_f3);
        pcVar8 = local_598.m_f4;
        if ((int)uVar7 < 0) {
          MPSInput::entryIgnored(&local_598,"column",local_598.m_f3,"bound",colname);
          goto LAB_00181f8a;
        }
        if (local_598.m_f4 == (char *)0x0) {
          p_Var18 = (_func_int *)0x0;
        }
        else {
          iVar6 = strcmp(local_598.m_f4,"-Inf");
          if ((iVar6 == 0) || (iVar6 = strcmp(pcVar8,"-inf"), iVar6 == 0)) {
            puVar14 = (ulong *)infinity();
            p_Var18 = (_func_int *)(*puVar14 ^ 0x8000000000000000);
          }
          else {
            iVar6 = strcmp(pcVar8,"Inf");
            if ((((iVar6 == 0) || (iVar6 = strcmp(pcVar8,"inf"), iVar6 == 0)) ||
                (iVar6 = strcmp(pcVar8,"+Inf"), iVar6 == 0)) ||
               (iVar6 = strcmp(pcVar8,"+inf"), iVar6 == 0)) {
              puVar9 = (undefined8 *)infinity();
              p_Var18 = (_func_int *)*puVar9;
            }
            else {
              p_Var18 = (_func_int *)atof(pcVar8);
            }
          }
        }
        if (local_598.m_f1[1] == 'I') {
          if (local_5e0 != (DIdxSet *)0x0) {
            DIdxSet::addIdx(local_5e0,uVar7);
          }
          iVar6 = IdxSet::pos((IdxSet *)&old_verbosity,uVar7);
          if (iVar6 < 0) {
            puVar9 = (undefined8 *)infinity();
            local_608->_vptr_SPxOut[uVar7] = (_func_int *)*puVar9;
            DIdxSet::addIdx((DIdxSet *)&old_verbosity,uVar7);
          }
        }
        cVar1 = *local_598.m_f1;
        switch(cVar1) {
        case 'L':
          pSVar15 = local_5e8;
          break;
        case 'M':
          puVar14 = (ulong *)infinity();
          p_Var18 = (_func_int *)(*puVar14 ^ 0x8000000000000000);
          pSVar15 = local_5e8;
          break;
        case 'N':
        case 'O':
        case 'Q':
        case 'R':
        case 'S':
        case 'T':
          goto switchD_00182231_caseD_4e;
        case 'P':
          puVar9 = (undefined8 *)infinity();
LAB_00182300:
          p_Var18 = (_func_int *)*puVar9;
          pSVar15 = local_608;
          break;
        case 'U':
          pSVar15 = local_608;
          break;
        default:
          if (cVar1 == 'B') {
            local_5e8->_vptr_SPxOut[uVar7] = (_func_int *)0x0;
            local_608->_vptr_SPxOut[uVar7] = (_func_int *)0x3ff0000000000000;
            if (local_5e0 != (DIdxSet *)0x0) {
              DIdxSet::addIdx(local_5e0,uVar7);
            }
            goto LAB_00181f8a;
          }
          if (cVar1 != 'F') goto switchD_00182231_caseD_4e;
          if (local_598.m_f1[1] != 'X') {
            puVar14 = (ulong *)infinity();
            local_5e8->_vptr_SPxOut[uVar7] = (_func_int *)(*puVar14 ^ 0x8000000000000000);
            puVar9 = (undefined8 *)infinity();
            goto LAB_00182300;
          }
          local_5e8->_vptr_SPxOut[uVar7] = p_Var18;
          pSVar15 = local_608;
        }
        pSVar15->_vptr_SPxOut[uVar7] = p_Var18;
      }
      goto LAB_00181f8a;
    }
switchD_00182231_caseD_4e:
    MPSInput::syntaxError(&local_598);
LAB_001823aa:
    DIdxSet::~DIdxSet((DIdxSet *)&old_verbosity);
  }
  if (local_598.m_section != ENDATA) {
    MPSInput::syntaxError(&local_598);
  }
  if (local_598.m_has_error == true) {
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1b])(this);
  }
  else {
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x45])
              (this,(ulong)(((local_598.m_objsense != MINIMIZE) - 1) +
                           (uint)(local_598.m_objsense != MINIMIZE)));
    pSVar15 = this->spxout;
    if ((pSVar15 != (SPxOut *)0x0) && (VVar2 = pSVar15->m_verbosity, 3 < (int)VVar2)) {
      colname[0] = (char)VVar2;
      colname[1] = (char)(VVar2 >> 8);
      colname[2] = (char)(VVar2 >> 0x10);
      colname[3] = (char)(VVar2 >> 0x18);
      _old_verbosity = (_func_int **)CONCAT44(uStack_234,4);
      (*pSVar15->_vptr_SPxOut[2])();
      pSVar15 = soplex::operator<<(this->spxout,"IMPSRD06 Objective sense: ");
      pcVar8 = "Maximize\n";
      if (local_598.m_objsense == MINIMIZE) {
        pcVar8 = "Minimize\n";
      }
      soplex::operator<<(pSVar15,pcVar8);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,colname);
    }
    added2Set(this,(SVSetBase<double> *)this,&local_5b8->super_SVSetBase<double>,
              (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
              (this,(ulong)(uint)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                 thenum);
  }
  if (local_5b0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_618);
    free(local_618);
    local_618 = (NameSet *)0x0;
  }
  if (local_5a8 == (NameSet *)0x0) {
    NameSet::~NameSet(local_5f0);
    free(local_5f0);
  }
  return (bool)(local_598.m_has_error ^ 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}